

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlCtxtInitializeLate(xmlParserCtxtPtr ctxt)

{
  _xmlSAXHandler *p_Var1;
  xmlChar *pxVar2;
  size_t limit;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    p_Var1 = ctxt->sax;
    if (((p_Var1 != (_xmlSAXHandler *)0x0 && (ctxt->options & 0x200) == 0) &&
        (p_Var1->initialized == 0xdeedbeaf)) &&
       (((p_Var1->startElementNs != (startElementNsSAX2Func)0x0 ||
         (p_Var1->endElementNs != (endElementNsSAX2Func)0x0)) ||
        ((p_Var1->startElement == (startElementSAXFunc)0x0 &&
         (p_Var1->endElement == (endElementSAXFunc)0x0)))))) {
      ctxt->sax2 = 1;
    }
    pxVar2 = xmlDictLookup(ctxt->dict,(xmlChar *)"xml",3);
    ctxt->str_xml = pxVar2;
    pxVar2 = xmlDictLookup(ctxt->dict,"xmlns",5);
    ctxt->str_xmlns = pxVar2;
    pxVar2 = xmlDictLookup(ctxt->dict,(xmlChar *)"http://www.w3.org/XML/1998/namespace",0x24);
    ctxt->str_xml_ns = pxVar2;
    if ((ctxt->str_xml == (xmlChar *)0x0) ||
       (pxVar2 == (xmlChar *)0x0 || ctxt->str_xmlns == (xmlChar *)0x0)) {
      xmlCtxtErrMemory(ctxt);
    }
    limit = 100000000;
    if (((uint)ctxt->options >> 0x13 & 1) != 0) {
      limit = 0;
    }
    xmlDictSetLimit(ctxt->dict,limit);
    return;
  }
  return;
}

Assistant:

static void
xmlCtxtInitializeLate(xmlParserCtxtPtr ctxt) {
    xmlSAXHandlerPtr sax;

    /* Avoid unused variable warning if features are disabled. */
    (void) sax;

    /*
     * Changing the SAX struct directly is still widespread practice
     * in internal and external code.
     */
    if (ctxt == NULL) return;
    sax = ctxt->sax;
#ifdef LIBXML_SAX1_ENABLED
    /*
     * Only enable SAX2 if there SAX2 element handlers, except when there
     * are no element handlers at all.
     */
    if (((ctxt->options & XML_PARSE_SAX1) == 0) &&
        (sax) &&
        (sax->initialized == XML_SAX2_MAGIC) &&
        ((sax->startElementNs != NULL) ||
         (sax->endElementNs != NULL) ||
         ((sax->startElement == NULL) && (sax->endElement == NULL))))
        ctxt->sax2 = 1;
#else
    ctxt->sax2 = 1;
#endif /* LIBXML_SAX1_ENABLED */

    /*
     * Some users replace the dictionary directly in the context struct.
     * We really need an API function to do that cleanly.
     */
    ctxt->str_xml = xmlDictLookup(ctxt->dict, BAD_CAST "xml", 3);
    ctxt->str_xmlns = xmlDictLookup(ctxt->dict, BAD_CAST "xmlns", 5);
    ctxt->str_xml_ns = xmlDictLookup(ctxt->dict, XML_XML_NAMESPACE, 36);
    if ((ctxt->str_xml==NULL) || (ctxt->str_xmlns==NULL) ||
		(ctxt->str_xml_ns == NULL)) {
        xmlErrMemory(ctxt);
    }

    xmlDictSetLimit(ctxt->dict,
                    (ctxt->options & XML_PARSE_HUGE) ?
                        0 :
                        XML_MAX_DICTIONARY_LIMIT);
}